

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinuxFileSystem.cpp
# Opt level: O3

void Diligent::LinuxFileSystem::ClearDirectory(Char *strPath,bool Recursive)

{
  code *__func;
  string path;
  allocator local_31;
  String local_30;
  
  std::__cxx11::string::string((string *)&local_30,strPath,&local_31);
  BasicFileSystem::CorrectSlashes(&local_30,'\0');
  __func = ClearDirectory::anon_class_1_0_00000001::__invoke;
  if (Recursive) {
    __func = ClearDirectory::anon_class_1_0_00000001::__invoke;
  }
  nftw(local_30._M_dataplus._M_p,__func,0x20,0xb);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void LinuxFileSystem::ClearDirectory(const Char* strPath, bool Recursive)
{
    std::string path{strPath};
    LinuxFileSystem::CorrectSlashes(path);

    auto Callaback = Recursive ?
        [](const char* Path, const struct stat* pStat, int Type, FTW* pFTWB) {
            if (pFTWB->level >= 1)
                return remove(Path);
            else
                return 0;
        } :
        [](const char* Path, const struct stat* pStat, int Type, FTW* pFTWB) {
            if (pFTWB->level == 1 && !S_ISDIR(pStat->st_mode))
                return remove(Path);
            else
                return 0;
        };

    nftw(path.c_str(), Callaback, MaxOpenNTFWDescriptors, FTW_DEPTH | FTW_MOUNT | FTW_PHYS);
}